

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_net_reader.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _func_int **__s;
  uint uVar1;
  ostream *poVar2;
  Reader *__p;
  element_type *peVar3;
  char *pcVar4;
  int local_ac;
  duration<long,_std::ratio<1L,_1000L>_> local_a8;
  undefined1 local_a0 [8];
  vector<char,_std::allocator<char>_> line;
  string local_80;
  allocator<char> local_49;
  string local_48;
  undefined1 local_28 [8];
  shared_ptr<diffusion::Reader> net_reader;
  char **argv_local;
  int argc_local;
  
  net_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  if (2 < argc) {
    pcVar4 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar4,&local_49);
    __s = net_reader.super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[1]._vptr__Sp_counted_base;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,(char *)__s,
               (allocator<char> *)
               &line.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    __p = diffusion::create_network_reader(&local_48,&local_80);
    std::shared_ptr<diffusion::Reader>::shared_ptr<diffusion::Reader,void>
              ((shared_ptr<diffusion::Reader> *)local_28,__p);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &line.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    do {
      while( true ) {
        peVar3 = std::
                 __shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
        uVar1 = (**peVar3->_vptr_Reader)();
        if ((uVar1 & 1) != 0) break;
        local_ac = 10;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&local_a8,&local_ac);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_a8);
      }
      peVar3 = std::__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_28);
      (*peVar3->_vptr_Reader[1])(local_a0);
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_a0);
      std::vector<char,_std::allocator<char>_>::size
                ((vector<char,_std::allocator<char>_> *)local_a0);
      std::ostream::write((char *)&std::cout,(long)pcVar4);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_a0);
    } while( true );
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,(char *)(net_reader.
                                           super___shared_ptr<diffusion::Reader,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_vptr__Sp_counted_base);
  poVar2 = std::operator<<(poVar2," writer_ip_address writer_port");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " writer_ip_address writer_port" << std::endl;
        return 0;
    }
    auto net_reader = std::shared_ptr<diffusion::Reader>(diffusion::create_network_reader(argv[1], argv[2]));
    while (true) {
        if (net_reader->can_read()) {
            auto line = net_reader->read();
            std::cout.write(line.data(), line.size());
            std::cout << std::endl;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(10));
        }
    }
    return 0;
}